

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O1

bool __thiscall ON_3dmRevisionHistory::IsEmpty(ON_3dmRevisionHistory *this)

{
  bool bVar1;
  int iVar2;
  tm local_48;
  
  if (this->m_revision_count == 0) {
    local_48.tm_sec = 0;
    local_48.tm_min = 0;
    local_48.tm_wday = 0;
    local_48.tm_yday = 0;
    local_48.tm_isdst = 0;
    local_48._36_4_ = 0;
    local_48.tm_gmtoff = 0;
    local_48.tm_zone = (char *)0x0;
    local_48.tm_hour = 0;
    local_48.tm_mday = 1;
    local_48.tm_mon = 0;
    local_48.tm_year = 0x46;
    iVar2 = ON_CompareRevisionHistoryTime(&local_48,&this->m_create_time);
    if (0 < iVar2) {
      local_48.tm_sec = 0;
      local_48.tm_min = 0;
      local_48.tm_wday = 0;
      local_48.tm_yday = 0;
      local_48.tm_isdst = 0;
      local_48._36_4_ = 0;
      local_48.tm_gmtoff = 0;
      local_48.tm_zone = (char *)0x0;
      local_48.tm_hour = 0;
      local_48.tm_mday = 1;
      local_48.tm_mon = 0;
      local_48.tm_year = 0x46;
      iVar2 = ON_CompareRevisionHistoryTime(&local_48,&this->m_last_edit_time);
      if (((0 < iVar2) && (bVar1 = ON_wString::IsEmpty(&this->m_sCreatedBy), bVar1)) &&
         (bVar1 = ON_wString::IsEmpty(&this->m_sLastEditedBy), bVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmRevisionHistory::IsEmpty() const
{
  if ( 0 == m_revision_count
       && !CreateTimeIsSet()
       && !LastEditedTimeIsSet()
       && m_sCreatedBy.IsEmpty()
       && m_sLastEditedBy.IsEmpty()
     )
  {
    return true;
  }
  return false;
}